

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMethod
          (DescriptorBuilder *this,MethodDescriptor *method,MethodDescriptorProto *proto)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  string_view undefined_symbol;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  string_view undefined_symbol_00;
  undefined8 *puVar1;
  Symbol SVar2;
  string_view name;
  string_view name_00;
  string_view element_name;
  string_view element_name_00;
  string_view name_01;
  string_view name_02;
  string_view element_name_01;
  string_view element_name_02;
  string_view relative_to;
  string_view relative_to_00;
  MethodDescriptorProto *local_60;
  MethodDescriptorProto **local_58;
  code *pcStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  MethodDescriptorProto **local_38;
  code *pcStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  puVar1 = (undefined8 *)
           ((ulong)(proto->field_0)._impl_.input_type_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  name._M_str = (char *)*puVar1;
  name._M_len = puVar1[1];
  relative_to._M_str = method->all_names_[1]._M_dataplus._M_p;
  relative_to._M_len = method->all_names_[1]._M_string_length;
  SVar2 = LookupSymbol(this,name,relative_to,PLACEHOLDER_MESSAGE,LOOKUP_ALL,
                       (bool)(this->pool_->lazily_build_dependencies_ ^ 1));
  if ((SVar2.ptr_)->symbol_type_ == '\x01') {
    internal::LazyDescriptor::Set(&method->input_type_,(Descriptor *)SVar2.ptr_);
  }
  else if ((SVar2.ptr_)->symbol_type_ == '\0') {
    if (this->pool_->lazily_build_dependencies_ == false) {
      puVar1 = (undefined8 *)
               ((ulong)(proto->field_0)._impl_.input_type_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      uStack_20 = *puVar1;
      local_28 = puVar1[1];
      undefined_symbol._M_str._0_4_ = (int)uStack_20;
      undefined_symbol._M_len = local_28;
      undefined_symbol._M_str._4_4_ = (int)((ulong)uStack_20 >> 0x20);
      element_name_00._M_str = method->all_names_[1]._M_dataplus._M_p;
      element_name_00._M_len = method->all_names_[1]._M_string_length;
      AddNotDefinedError(this,element_name_00,&proto->super_Message,INPUT_TYPE,undefined_symbol);
    }
    else {
      puVar1 = (undefined8 *)
               ((ulong)(proto->field_0)._impl_.input_type_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      name_00._M_str = (char *)*puVar1;
      name_00._M_len = puVar1[1];
      internal::LazyDescriptor::SetLazy(&method->input_type_,name_00,this->file_);
    }
  }
  else {
    local_38 = &local_60;
    pcStack_30 = absl::lts_20240722::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkMethod(google::protobuf::MethodDescriptor*,google::protobuf::MethodDescriptorProto_const&)::__0,std::__cxx11::string>
    ;
    make_error.invoker_._0_4_ = 0x203e09;
    make_error.ptr_.obj = local_38;
    make_error.invoker_._4_4_ = 0;
    element_name._M_str = method->all_names_[1]._M_dataplus._M_p;
    element_name._M_len = method->all_names_[1]._M_string_length;
    local_60 = proto;
    AddError(this,element_name,&proto->super_Message,INPUT_TYPE,make_error);
  }
  puVar1 = (undefined8 *)
           ((ulong)(proto->field_0)._impl_.output_type_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  name_01._M_str = (char *)*puVar1;
  name_01._M_len = puVar1[1];
  relative_to_00._M_str = method->all_names_[1]._M_dataplus._M_p;
  relative_to_00._M_len = method->all_names_[1]._M_string_length;
  SVar2 = LookupSymbol(this,name_01,relative_to_00,PLACEHOLDER_MESSAGE,LOOKUP_ALL,
                       (bool)(this->pool_->lazily_build_dependencies_ ^ 1));
  if ((SVar2.ptr_)->symbol_type_ == '\x01') {
    internal::LazyDescriptor::Set(&method->output_type_,(Descriptor *)SVar2.ptr_);
  }
  else if ((SVar2.ptr_)->symbol_type_ == '\0') {
    if (this->pool_->lazily_build_dependencies_ == false) {
      puVar1 = (undefined8 *)
               ((ulong)(proto->field_0)._impl_.output_type_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      uStack_40 = *puVar1;
      local_48 = puVar1[1];
      undefined_symbol_00._M_str._0_4_ = (int)uStack_40;
      undefined_symbol_00._M_len = local_48;
      undefined_symbol_00._M_str._4_4_ = (int)((ulong)uStack_40 >> 0x20);
      element_name_02._M_str = method->all_names_[1]._M_dataplus._M_p;
      element_name_02._M_len = method->all_names_[1]._M_string_length;
      AddNotDefinedError(this,element_name_02,&proto->super_Message,OUTPUT_TYPE,undefined_symbol_00)
      ;
    }
    else {
      puVar1 = (undefined8 *)
               ((ulong)(proto->field_0)._impl_.output_type_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
      name_02._M_str = (char *)*puVar1;
      name_02._M_len = puVar1[1];
      internal::LazyDescriptor::SetLazy(&method->output_type_,name_02,this->file_);
    }
  }
  else {
    local_58 = &local_60;
    pcStack_50 = absl::lts_20240722::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkMethod(google::protobuf::MethodDescriptor*,google::protobuf::MethodDescriptorProto_const&)::__1,std::__cxx11::string>
    ;
    make_error_00.invoker_._0_4_ = 0x203e72;
    make_error_00.ptr_.obj = local_58;
    make_error_00.invoker_._4_4_ = 0;
    element_name_01._M_str = method->all_names_[1]._M_dataplus._M_p;
    element_name_01._M_len = method->all_names_[1]._M_string_length;
    local_60 = proto;
    AddError(this,element_name_01,&proto->super_Message,OUTPUT_TYPE,make_error_00);
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMethod(MethodDescriptor* method,
                                        const MethodDescriptorProto& proto) {
  Symbol input_type =
      LookupSymbol(proto.input_type(), method->full_name(),
                   DescriptorPool::PLACEHOLDER_MESSAGE, LOOKUP_ALL,
                   !pool_->lazily_build_dependencies_);
  if (input_type.IsNull()) {
    if (!pool_->lazily_build_dependencies_) {
      AddNotDefinedError(method->full_name(), proto,
                         DescriptorPool::ErrorCollector::INPUT_TYPE,
                         proto.input_type());
    } else {
      method->input_type_.SetLazy(proto.input_type(), file_);
    }
  } else if (input_type.type() != Symbol::MESSAGE) {
    AddError(method->full_name(), proto,
             DescriptorPool::ErrorCollector::INPUT_TYPE, [&] {
               return absl::StrCat("\"", proto.input_type(),
                                   "\" is not a message type.");
             });
  } else {
    method->input_type_.Set(input_type.descriptor());
  }

  Symbol output_type =
      LookupSymbol(proto.output_type(), method->full_name(),
                   DescriptorPool::PLACEHOLDER_MESSAGE, LOOKUP_ALL,
                   !pool_->lazily_build_dependencies_);
  if (output_type.IsNull()) {
    if (!pool_->lazily_build_dependencies_) {
      AddNotDefinedError(method->full_name(), proto,
                         DescriptorPool::ErrorCollector::OUTPUT_TYPE,
                         proto.output_type());
    } else {
      method->output_type_.SetLazy(proto.output_type(), file_);
    }
  } else if (output_type.type() != Symbol::MESSAGE) {
    AddError(method->full_name(), proto,
             DescriptorPool::ErrorCollector::OUTPUT_TYPE, [&] {
               return absl::StrCat("\"", proto.output_type(),
                                   "\" is not a message type.");
             });
  } else {
    method->output_type_.Set(output_type.descriptor());
  }
}